

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsInstanceOf(JsValueRef object,JsValueRef constructor,bool *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  RecyclableObject *pRVar3;
  Var aValue;
  JavascriptBoolean *pJVar4;
  ScriptContext *__localScriptContext;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_00363b89;
  }
  scriptContext = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTInstanceOf
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,object,constructor);
  }
  exitStatus = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    if ((ulong)object >> 0x30 == 0) {
      pRVar3 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00363b77;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
      }
    }
    exitStatus = JsErrorInvalidArgument;
    if (constructor != (JsValueRef)0x0) {
      if (constructor < &DAT_1000000000000) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(constructor);
        pSVar1 = (((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          exitStatus = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00363b77;
          constructor = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
      }
      if (result == (bool *)0x0) {
        exitStatus = JsErrorNullArgument;
      }
      else {
        aValue = Js::JavascriptOperators::OP_IsInst
                           (object,constructor,scriptContext,(IsInstInlineCache *)0x0);
        pJVar4 = Js::VarTo<Js::JavascriptBoolean>(aValue);
        *result = pJVar4->value != 0;
        exitStatus = JsNoError;
      }
    }
  }
LAB_00363b77:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_00363b89:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsInstanceOf(_In_ JsValueRef object, _In_ JsValueRef constructor, _Out_ bool *result) {
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTInstanceOf, object, constructor);

        VALIDATE_INCOMING_REFERENCE(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(constructor, scriptContext);
        PARAM_NOT_NULL(result);

        Js::Var value = Js::JavascriptOperators::OP_IsInst(object, constructor, scriptContext, nullptr);
        *result = !!Js::VarTo<Js::JavascriptBoolean>(value)->GetValue();

        return JsNoError;
    });
}